

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::visitCall(I64ToI32Lowering *this,Call *curr)

{
  long *plVar1;
  char *pcVar2;
  Function *pFVar3;
  Call *pCVar4;
  undefined8 *puVar5;
  Expression *pEVar6;
  Signature SVar7;
  string_view sVar8;
  long *local_210;
  IString *local_208;
  long local_200 [47];
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  Call *local_68;
  Call *curr_local;
  long local_58;
  Expression *local_50;
  Expression **local_40;
  size_t local_38;
  Expression *local_30 [2];
  
  local_68 = curr;
  if (curr->isReturn == true) {
    pFVar3 = Module::getFunction((this->
                                 super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                 .
                                 super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                 .currModule,(Name)(curr->target).super_IString.str);
    SVar7 = HeapType::getSignature(&pFVar3->type);
    if (SVar7.results.id.id == 3) {
      Fatal::Fatal((Fatal *)&local_210);
      Fatal::operator<<((Fatal *)&local_210,
                        (char (*) [62])
                        "i64 to i32 lowering of return_call values not yet implemented");
      Fatal::~Fatal((Fatal *)&local_210);
    }
  }
  local_88._8_8_ = &local_68;
  pcStack_70 = std::
               _Function_handler<wasm::Call_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp:264:13)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<wasm::Call_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp:264:13)>
             ::_M_manager;
  local_88._M_unused._M_object = this;
  pCVar4 = visitGenericCall<wasm::Call>(this,local_68,(BuilderFunc<wasm::Call> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (pCVar4 == (Call *)0x0) {
    return;
  }
  pFVar3 = Module::getFunction((this->
                               super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                               ).
                               super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                               .
                               super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                               .currModule,(Name)(pCVar4->target).super_IString.str);
  if ((pFVar3->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    return;
  }
  curr_local = (Call *)&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&curr_local,"legalfunc$","");
  pcVar2 = (pCVar4->target).super_IString.str._M_str;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,pcVar2,pcVar2 + (pCVar4->target).super_IString.str._M_len);
  pEVar6 = (Expression *)0xf;
  if (curr_local != (Call *)&local_50) {
    pEVar6 = local_50;
  }
  if (pEVar6 < (Expression *)(local_38 + local_58)) {
    pEVar6 = (Expression *)0xf;
    if (local_40 != local_30) {
      pEVar6 = local_30[0];
    }
    if ((Expression *)(local_38 + local_58) <= pEVar6) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)curr_local);
      goto LAB_008e1c8d;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&curr_local,(ulong)local_40);
LAB_008e1c8d:
  local_210 = local_200;
  plVar1 = puVar5 + 2;
  if ((long *)*puVar5 == plVar1) {
    local_200[0] = *plVar1;
    local_200[1] = puVar5[3];
  }
  else {
    local_200[0] = *plVar1;
    local_210 = (long *)*puVar5;
  }
  local_208 = (IString *)puVar5[1];
  *puVar5 = plVar1;
  puVar5[1] = 0;
  *(undefined1 *)plVar1 = 0;
  sVar8._M_str = (char *)0x0;
  sVar8._M_len = (size_t)local_210;
  sVar8 = IString::interned(local_208,sVar8,SUB81(plVar1,0));
  (pCVar4->target).super_IString.str = sVar8;
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,(ulong)&local_30[0]->field_0x1);
  }
  if (curr_local != (Call *)&local_50) {
    operator_delete(curr_local,(ulong)&local_50->field_0x1);
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
    if (curr->isReturn &&
        getModule()->getFunction(curr->target)->getResults() == Type::i64) {
      Fatal()
        << "i64 to i32 lowering of return_call values not yet implemented";
    }
    auto* fixedCall = visitGenericCall<Call>(
      curr, [&](std::vector<Expression*>& args, Type results) {
        return builder->makeCall(curr->target, args, results, curr->isReturn);
      });
    // If this was to an import, we need to call the legal version. This assumes
    // that legalize-js-interface has been run before.
    if (fixedCall && getModule()->getFunction(fixedCall->target)->imported()) {
      fixedCall->target =
        std::string("legalfunc$") + fixedCall->target.toString();
      return;
    }
  }